

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O1

void __thiscall
jrtplib::RTCPCompoundPacketBuilder::ClearBuildBuffers(RTCPCompoundPacketBuilder *this)

{
  RTPMemoryManager *pRVar1;
  _List_node_base *p_Var2;
  
  Report::Clear(&this->report);
  SDES::Clear(&this->sdes);
  for (p_Var2 = (this->byepackets).
                super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->byepackets; p_Var2 = p_Var2->_M_next) {
    if (p_Var2[1]._M_next != (_List_node_base *)0x0) {
      pRVar1 = (this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr;
      if (pRVar1 == (RTPMemoryManager *)0x0) {
        operator_delete__(p_Var2[1]._M_next);
      }
      else {
        (*pRVar1->_vptr_RTPMemoryManager[3])();
      }
    }
  }
  for (p_Var2 = (this->apppackets).
                super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->apppackets; p_Var2 = p_Var2->_M_next) {
    if (p_Var2[1]._M_next != (_List_node_base *)0x0) {
      pRVar1 = (this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr;
      if (pRVar1 == (RTPMemoryManager *)0x0) {
        operator_delete__(p_Var2[1]._M_next);
      }
      else {
        (*pRVar1->_vptr_RTPMemoryManager[3])();
      }
    }
  }
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::clear(&this->byepackets);
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::clear(&this->apppackets);
  this->byesize = 0;
  this->appsize = 0;
  return;
}

Assistant:

void RTCPCompoundPacketBuilder::ClearBuildBuffers()
{
	report.Clear();
	sdes.Clear();

	std::list<Buffer>::const_iterator it;
	for (it = byepackets.begin() ; it != byepackets.end() ; it++)
	{
		if ((*it).packetdata)
			RTPDeleteByteArray((*it).packetdata,GetMemoryManager());
	}
	for (it = apppackets.begin() ; it != apppackets.end() ; it++)
	{
		if ((*it).packetdata)
			RTPDeleteByteArray((*it).packetdata,GetMemoryManager());
	}
#ifdef RTP_SUPPORT_RTCPUNKNOWN
	for (it = unknownpackets.begin() ; it != unknownpackets.end() ; it++)
	{
		if ((*it).packetdata)
			RTPDeleteByteArray((*it).packetdata,GetMemoryManager());
	}
#endif // RTP_SUPPORT_RTCPUNKNOWN 

	byepackets.clear();
	apppackets.clear();
#ifdef RTP_SUPPORT_RTCPUNKNOWN
	unknownpackets.clear();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	byesize = 0;
	appsize = 0;
#ifdef RTP_SUPPORT_RTCPUNKNOWN
	unknownsize = 0;
#endif // RTP_SUPPORT_RTCPUNKNOWN 
}